

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

FileInfo * __thiscall llbuild::buildsystem::BuildValue::getOutputInfo(BuildValue *this)

{
  bool bVar1;
  BuildValue *this_local;
  
  bVar1 = kindHasOutputInfo(this);
  if (!bVar1) {
    __assert_fail("kindHasOutputInfo() && \"invalid call for value kind\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                  ,0x18b,"const FileInfo &llbuild::buildsystem::BuildValue::getOutputInfo() const");
  }
  bVar1 = hasMultipleOutputs(this);
  if (bVar1) {
    __assert_fail("!hasMultipleOutputs() && \"invalid call on result with multiple outputs\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                  ,0x18d,"const FileInfo &llbuild::buildsystem::BuildValue::getOutputInfo() const");
  }
  return (FileInfo *)&this->valueData;
}

Assistant:

const FileInfo& getOutputInfo() const {
    assert(kindHasOutputInfo() && "invalid call for value kind");
    assert(!hasMultipleOutputs() &&
           "invalid call on result with multiple outputs");
    return valueData.asOutputInfo;
  }